

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

SynchEvent *
absl::lts_20250127::EnsureSynchEvent(atomic<long> *addr,char *name,intptr_t bits,intptr_t lockbit)

{
  SynchEvent *pSVar1;
  bool bVar2;
  int iVar3;
  uintptr_t uVar4;
  size_t sVar5;
  uintptr_t uVar6;
  ulong uVar7;
  size_t l;
  SynchEvent *e;
  SynchEvent *next;
  SynchEvent *e_1;
  SynchEvent **head;
  SynchEvent **__end3;
  SynchEvent **__begin3;
  SynchEvent *(*__range3) [1031];
  char *absl_raw_log_internal_basename;
  size_t kMaxSynchEventCount;
  uint32_t h;
  intptr_t lockbit_local;
  intptr_t bits_local;
  char *name_local;
  atomic<long> *addr_local;
  
  uVar7 = (ulong)addr % 0x407;
  base_internal::SpinLock::Lock((SpinLock *)&synch_event_mu);
  EnsureSynchEvent::synch_event_count = EnsureSynchEvent::synch_event_count + 1;
  if (0x19000 < EnsureSynchEvent::synch_event_count) {
    EnsureSynchEvent::synch_event_count = 0;
    raw_log_internal::RawLog
              (kError,"mutex.cc",0x166,
               "Accumulated %zu Mutex debug objects. If you see this in production, it may mean that the production code accidentally calls Mutex/CondVar::EnableDebugLog/EnableInvariantDebugging."
               ,0x19000);
    for (__end3 = (SynchEvent **)&synch_event; __end3 != (SynchEvent **)&synch_event_mu;
        __end3 = __end3 + 1) {
      pSVar1 = *__end3;
      while (next = pSVar1, next != (SynchEvent *)0x0) {
        pSVar1 = next->next;
        iVar3 = next->refcount + -1;
        next->refcount = iVar3;
        if (iVar3 == 0) {
          base_internal::LowLevelAlloc::Free(next);
        }
      }
      *__end3 = (SynchEvent *)0x0;
    }
  }
  l = 0;
  bVar2 = AtomicSetBits(addr,bits,lockbit);
  if (!bVar2) {
    l = (&synch_event)[uVar7];
    while( true ) {
      bVar2 = false;
      if (l != 0) {
        uVar6 = *(uintptr_t *)(l + 0x10);
        uVar4 = base_internal::HidePtr<std::atomic<long>>(addr);
        bVar2 = uVar6 != uVar4;
      }
      if (!bVar2) break;
      l = *(size_t *)(l + 8);
    }
  }
  if (l == 0) {
    bits_local = (intptr_t)name;
    if (name == (char *)0x0) {
      bits_local = (long)
                   "/* This file was generated by upb_generator from the input file:\n *\n *     $0\n *\n * Do not edit -- your changes will be discarded when the file is\n * regenerated.\n * NO CHECKED-IN PROTOBUF GENCODE */\n\n"
                   + 0xc9;
    }
    sVar5 = strlen((char *)bits_local);
    l = (size_t)base_internal::LowLevelAlloc::Alloc(sVar5 + 0x30);
    *(undefined4 *)l = 2;
    uVar6 = base_internal::HidePtr<std::atomic<long>>(addr);
    *(uintptr_t *)(l + 0x10) = uVar6;
    *(undefined8 *)(l + 0x18) = 0;
    *(undefined8 *)(l + 0x20) = 0;
    *(undefined1 *)(l + 0x28) = 0;
    strcpy((char *)(l + 0x29),(char *)bits_local);
    *(undefined8 *)(l + 8) = (&synch_event)[uVar7];
    (&synch_event)[uVar7] = l;
  }
  else {
    *(int *)l = *(int *)l + 1;
  }
  base_internal::SpinLock::Unlock((SpinLock *)&synch_event_mu);
  return (SynchEvent *)l;
}

Assistant:

static SynchEvent* EnsureSynchEvent(std::atomic<intptr_t>* addr,
                                    const char* name, intptr_t bits,
                                    intptr_t lockbit) {
  uint32_t h = reinterpret_cast<uintptr_t>(addr) % kNSynchEvent;
  synch_event_mu.Lock();
  // When a Mutex/CondVar is destroyed, we don't remove the associated
  // SynchEvent to keep destructors empty in release builds for performance
  // reasons. If the current call is the first to set bits (kMuEvent/kCVEvent),
  // we don't look up the existing even because (if it exists, it must be for
  // the previous Mutex/CondVar that existed at the same address).
  // The leaking events must not be a problem for tests, which should create
  // bounded amount of events. And debug logging is not supposed to be enabled
  // in production. However, if it's accidentally enabled, or briefly enabled
  // for some debugging, we don't want to crash the program. Instead we drop
  // all events, if we accumulated too many of them. Size of a single event
  // is ~48 bytes, so 100K events is ~5 MB.
  // Additionally we could delete the old event for the same address,
  // but it would require a better hashmap (if we accumulate too many events,
  // linked lists will grow and traversing them will be very slow).
  constexpr size_t kMaxSynchEventCount = 100 << 10;
  // Total number of live synch events.
  static size_t synch_event_count ABSL_GUARDED_BY(synch_event_mu);
  if (++synch_event_count > kMaxSynchEventCount) {
    synch_event_count = 0;
    ABSL_RAW_LOG(ERROR,
                 "Accumulated %zu Mutex debug objects. If you see this"
                 " in production, it may mean that the production code"
                 " accidentally calls "
                 "Mutex/CondVar::EnableDebugLog/EnableInvariantDebugging.",
                 kMaxSynchEventCount);
    for (auto*& head : synch_event) {
      for (auto* e = head; e != nullptr;) {
        SynchEvent* next = e->next;
        if (--(e->refcount) == 0) {
          base_internal::LowLevelAlloc::Free(e);
        }
        e = next;
      }
      head = nullptr;
    }
  }
  SynchEvent* e = nullptr;
  if (!AtomicSetBits(addr, bits, lockbit)) {
    for (e = synch_event[h];
         e != nullptr && e->masked_addr != base_internal::HidePtr(addr);
         e = e->next) {
    }
  }
  if (e == nullptr) {  // no SynchEvent struct found; make one.
    if (name == nullptr) {
      name = "";
    }
    size_t l = strlen(name);
    e = reinterpret_cast<SynchEvent*>(
        base_internal::LowLevelAlloc::Alloc(sizeof(*e) + l));
    e->refcount = 2;  // one for return value, one for linked list
    e->masked_addr = base_internal::HidePtr(addr);
    e->invariant = nullptr;
    e->arg = nullptr;
    e->log = false;
    strcpy(e->name, name);  // NOLINT(runtime/printf)
    e->next = synch_event[h];
    synch_event[h] = e;
  } else {
    e->refcount++;  // for return value
  }
  synch_event_mu.Unlock();
  return e;
}